

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

Solution * calculate_one_solution(Solution *__return_storage_ptr__,int argc,Edge *edges,int maxNode)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Solution *pSVar4;
  ulong uVar5;
  undefined8 uStack_40;
  Solution *local_38;
  
  local_38 = __return_storage_ptr__;
  lVar1 = -((ulong)(uint)maxNode * 4 + 0xf & 0xfffffffffffffff0);
  lVar2 = lVar1 + -0x38;
  if (0 < maxNode) {
    uVar5 = 0;
    do {
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101688;
      iVar3 = rand();
      *(int *)((long)&local_38 + uVar5 * 4 + lVar2 + 0x38) = iVar3 % 3 + 1;
      uVar5 = uVar5 + 1;
    } while ((uint)maxNode != uVar5);
  }
  pSVar4 = (Solution *)0x0;
  if (1 < argc) {
    uVar5 = 0;
    pSVar4 = (Solution *)0x0;
    do {
      if (*(int *)((long)&local_38 + (long)edges[uVar5].start * 4 + lVar2 + 0x38) ==
          *(int *)((long)&local_38 + (long)edges[uVar5].end * 4 + lVar2 + 0x38)) {
        iVar3 = (int)pSVar4;
        if (7 < iVar3) {
          pSVar4 = (Solution *)0xffffffff;
          break;
        }
        local_38->edges[iVar3] = edges[uVar5];
        pSVar4 = (Solution *)(ulong)(iVar3 + 1);
      }
      uVar5 = uVar5 + 1;
    } while (argc - 1 != uVar5);
  }
  local_38->amount = (int)pSVar4;
  return pSVar4;
}

Assistant:

static Solution calculate_one_solution(const int argc, const Edge *edges, const int maxNode)
{
	Solution newSolution;

	int node_color[maxNode];
	for (int i = 0; i < maxNode; i++)
	{
		int num = (rand() % (3)) + 1;
		node_color[i] = num;
	}

	int NumberColorConflicts = 0;
	for (int i = 0; i < argc - 1; i++)
	{
		if (node_color[edges[i].start] == node_color[edges[i].end])
		{
			if (NumberColorConflicts >= MAXRETURN)	// if to many conflicts are found
			{
				newSolution.amount = -1;	// indicates that to many are found
				return newSolution;
			}
			newSolution.edges[NumberColorConflicts] = edges[i];
			NumberColorConflicts++;
		}
	}
	newSolution.amount = NumberColorConflicts;
	return newSolution;
}